

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O2

void duckdb_je_psset_remove(psset_t *psset,hpdata_t *ps)

{
  ps->h_in_psset = false;
  psset_stats_remove(psset,ps);
  if (ps->h_in_psset_alloc_container == true) {
    psset_alloc_container_remove(psset,ps);
  }
  psset_maybe_remove_purge_list(psset,ps);
  if (ps->h_in_psset_hugify_container == true) {
    ps->h_in_psset_hugify_container = false;
    hpdata_hugify_list_remove(&psset->to_hugify,ps);
    return;
  }
  return;
}

Assistant:

void
psset_remove(psset_t *psset, hpdata_t *ps) {
	hpdata_in_psset_set(ps, false);

	psset_stats_remove(psset, ps);
	if (hpdata_in_psset_alloc_container_get(ps)) {
		psset_alloc_container_remove(psset, ps);
	}
	psset_maybe_remove_purge_list(psset, ps);
	if (hpdata_in_psset_hugify_container_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, false);
		hpdata_hugify_list_remove(&psset->to_hugify, ps);
	}
}